

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yprintf.c
# Opt level: O3

void ansi_clear_line(ParamOutputLv level)

{
  ParamOutputLv PVar1;
  int iVar2;
  
  PVar1 = output_lv();
  if (level <= PVar1) {
    iVar2 = isatty(2);
    if (iVar2 == 0) {
      fputs("\n",_stderr);
      return;
    }
    ansi_clear_line_cold_1();
  }
  return;
}

Assistant:

void ansi_clear_line(ParamOutputLv level)
{
  if (output_lv() < level)
    return;

#if !defined(__MINGW32__)
  if (isatty(2))
    fprintf(stderr, "\x1B[2K\r");
  else
    fputs("\n", stderr);
#else
  fputs("\n", stderr);
#endif  // !defined(__MINGW32__)
}